

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O1

void __thiscall Arithmetic_BinaryOperations_Test::TestBody(Arithmetic_BinaryOperations_Test *this)

{
  undefined4 uVar1;
  AssertionResult *this_00;
  char *pcVar2;
  char *in_R9;
  bool bVar3;
  undefined1 local_178 [8];
  MockParser mock;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  
  MockParser::MockParser((MockParser *)local_178,"let a = 3\nlet b = a + 3\nlet c = a * 10\n");
  bVar3 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar3;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xc9,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (gtest_ar_.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar1 = *(undefined4 *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
  local_30 = (undefined1  [8])(CONCAT44(local_30._4_4_,uVar1) & 0xffffffff000000ff);
  gtest_ar_.message_.ptr_._0_4_ = 1;
  mock.cur_fn = mock.cur_fn + 1;
  testing::internal::CmpHelperEQ<BcOp,BcOp>
            ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)local_30,
             (BcOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
      local_30 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (char)((uint)uVar1 >> 8);
  local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,(int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
      local_30 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_2_ = (short)((uint)uVar1 >> 0x10);
  local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
      local_30 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar3;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xca,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (gtest_ar_.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar1 = *(undefined4 *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
  local_30 = (undefined1  [8])(CONCAT44(local_30._4_4_,uVar1) & 0xffffffff000000ff);
  gtest_ar_.message_.ptr_._0_4_ = 5;
  mock.cur_fn = mock.cur_fn + 1;
  testing::internal::CmpHelperEQ<BcOp,BcOp>
            ((internal *)local_50,"bc_op(ins)","BC_ADD_LN",(BcOp *)local_30,
             (BcOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xca,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
      local_30 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (char)((uint)uVar1 >> 8);
  local_30._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_50,"bc_arg1(ins)","1",(uchar *)&gtest_ar_.message_,(int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xca,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
      local_30 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_2_ = (short)((uint)uVar1 >> 0x10);
  local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xca,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
      local_30 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar3;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xcb,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (gtest_ar_.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar1 = *(undefined4 *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
  local_30 = (undefined1  [8])(CONCAT44(local_30._4_4_,uVar1) & 0xffffffff000000ff);
  gtest_ar_.message_.ptr_._0_4_ = 10;
  mock.cur_fn = mock.cur_fn + 1;
  testing::internal::CmpHelperEQ<BcOp,BcOp>
            ((internal *)local_50,"bc_op(ins)","BC_MUL_LN",(BcOp *)local_30,
             (BcOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
      local_30 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (char)((uint)uVar1 >> 8);
  local_30._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_50,"bc_arg1(ins)","2",(uchar *)&gtest_ar_.message_,(int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
      local_30 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (char)((uint)uVar1 >> 0x10);
  local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_50,"bc_arg2(ins)","0",(uchar *)&gtest_ar_.message_,(int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
      local_30 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_001160d6;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (char)((uint)uVar1 >> 0x18);
  local_30._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_50,"bc_arg3(ins)","1",(uchar *)&gtest_ar_.message_,(int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    goto LAB_001165cc;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  bVar3 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar3;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar3) {
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
    uVar1 = *(undefined4 *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4)
    ;
    local_30 = (undefined1  [8])(CONCAT44(local_30._4_4_,uVar1) & 0xffffffff000000ff);
    gtest_ar_.message_.ptr_._0_4_ = 0x20;
    mock.cur_fn = mock.cur_fn + 1;
    testing::internal::CmpHelperEQ<BcOp,BcOp>
              ((internal *)local_50,"bc_op(ins)","BC_RET",(BcOp *)local_30,
               (BcOp *)&gtest_ar_.message_);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0xcc,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
LAB_001165cc:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message((Message *)local_30);
    }
    else {
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (char)((uint)uVar1 >> 8);
      local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0xcc,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001165cc;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (char)((uint)uVar1 >> 0x10);
      local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg2(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0xcc,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001165cc;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (char)((uint)uVar1 >> 0x18);
      local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg3(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0xcc,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001165cc;
      }
    }
    this_00 = (AssertionResult *)local_50;
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xcc,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    testing::Message::~Message((Message *)&gtest_ar_.message_);
    this_00 = (AssertionResult *)local_30;
  }
  testing::AssertionResult::~AssertionResult(this_00);
LAB_001160d6:
  vm_free((VM *)local_178);
  return;
}

Assistant:

TEST(Arithmetic, BinaryOperations) {
	MockParser mock(
		"let a = 3\n"
		"let b = a + 3\n"
		"let c = a * 10\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_ADD_LN, 1, 0);
	INS(BC_MUL_LN, 2, 0, 1);
	INS(BC_RET, 0, 0, 0);
}